

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O1

void __thiscall
InplaceSolverIslandCallback::processIsland
          (InplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  uint uVar1;
  int iVar2;
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  btCollisionObject **ppbVar3;
  long lVar4;
  btPersistentManifold **ppbVar5;
  btTypedConstraint **ppbVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  int iVar13;
  btTypedConstraint **ppbVar14;
  
  if (islandId < 0) {
    pp_Var12 = this->m_solver->_vptr_btConstraintSolver;
  }
  else {
    uVar1 = this->m_numConstraints;
    uVar8 = 0;
    if ((int)uVar1 < 1) {
      uVar11 = 0;
      ppbVar14 = (btTypedConstraint **)0x0;
    }
    else {
      ppbVar14 = this->m_sortedConstraints;
      uVar11 = 0;
      do {
        iVar13 = ((*ppbVar14)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar13 < 0) {
          iVar13 = ((*ppbVar14)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        if (iVar13 == islandId) goto LAB_001b096b;
        uVar11 = uVar11 + 1;
        ppbVar14 = ppbVar14 + 1;
      } while (uVar1 != uVar11);
      ppbVar14 = (btTypedConstraint **)0x0;
      uVar11 = (ulong)uVar1;
    }
LAB_001b096b:
    if ((int)uVar11 < (int)uVar1) {
      ppbVar6 = this->m_sortedConstraints + (uVar11 & 0xffffffff);
      uVar8 = 0;
      do {
        iVar13 = ((*ppbVar6)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar13 < 0) {
          iVar13 = ((*ppbVar6)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        uVar8 = uVar8 + (iVar13 == islandId);
        ppbVar6 = ppbVar6 + 1;
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
      } while ((int)uVar10 < (int)uVar1);
    }
    if (1 < (this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
      if (0 < numBodies) {
        uVar11 = 0;
        do {
          iVar13 = (this->m_bodies).m_size;
          iVar2 = (this->m_bodies).m_capacity;
          if (iVar13 == iVar2) {
            iVar9 = iVar13 * 2;
            if (iVar13 == 0) {
              iVar9 = 1;
            }
            if (iVar2 < iVar9) {
              if (iVar9 == 0) {
                ppbVar3 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar3 = (btCollisionObject **)btAlignedAllocInternal((long)iVar9 << 3,0x10);
              }
              lVar4 = (long)(this->m_bodies).m_size;
              if (0 < lVar4) {
                lVar7 = 0;
                do {
                  ppbVar3[lVar7] = (this->m_bodies).m_data[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar4 != lVar7);
              }
              ptr = (this->m_bodies).m_data;
              if (ptr != (btCollisionObject **)0x0) {
                if ((this->m_bodies).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr);
                }
                (this->m_bodies).m_data = (btCollisionObject **)0x0;
              }
              (this->m_bodies).m_ownsMemory = true;
              (this->m_bodies).m_data = ppbVar3;
              (this->m_bodies).m_capacity = iVar9;
            }
          }
          iVar13 = (this->m_bodies).m_size;
          (this->m_bodies).m_data[iVar13] = bodies[uVar11];
          (this->m_bodies).m_size = iVar13 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)numBodies);
      }
      if (0 < numManifolds) {
        uVar11 = 0;
        do {
          iVar13 = (this->m_manifolds).m_size;
          iVar2 = (this->m_manifolds).m_capacity;
          if (iVar13 == iVar2) {
            iVar9 = iVar13 * 2;
            if (iVar13 == 0) {
              iVar9 = 1;
            }
            if (iVar2 < iVar9) {
              if (iVar9 == 0) {
                ppbVar5 = (btPersistentManifold **)0x0;
              }
              else {
                ppbVar5 = (btPersistentManifold **)btAlignedAllocInternal((long)iVar9 << 3,0x10);
              }
              lVar4 = (long)(this->m_manifolds).m_size;
              if (0 < lVar4) {
                lVar7 = 0;
                do {
                  ppbVar5[lVar7] = (this->m_manifolds).m_data[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar4 != lVar7);
              }
              ptr_00 = (this->m_manifolds).m_data;
              if (ptr_00 != (btPersistentManifold **)0x0) {
                if ((this->m_manifolds).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr_00);
                }
                (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
              }
              (this->m_manifolds).m_ownsMemory = true;
              (this->m_manifolds).m_data = ppbVar5;
              (this->m_manifolds).m_capacity = iVar9;
            }
          }
          iVar13 = (this->m_manifolds).m_size;
          (this->m_manifolds).m_data[iVar13] = manifolds[uVar11];
          (this->m_manifolds).m_size = iVar13 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)numManifolds);
      }
      if (0 < (int)uVar8) {
        uVar11 = 0;
        do {
          iVar13 = (this->m_constraints).m_size;
          iVar2 = (this->m_constraints).m_capacity;
          if (iVar13 == iVar2) {
            iVar9 = iVar13 * 2;
            if (iVar13 == 0) {
              iVar9 = 1;
            }
            if (iVar2 < iVar9) {
              if (iVar9 == 0) {
                ppbVar6 = (btTypedConstraint **)0x0;
              }
              else {
                ppbVar6 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar9 << 3,0x10);
              }
              lVar4 = (long)(this->m_constraints).m_size;
              if (0 < lVar4) {
                lVar7 = 0;
                do {
                  ppbVar6[lVar7] = (this->m_constraints).m_data[lVar7];
                  lVar7 = lVar7 + 1;
                } while (lVar4 != lVar7);
              }
              ptr_01 = (this->m_constraints).m_data;
              if (ptr_01 != (btTypedConstraint **)0x0) {
                if ((this->m_constraints).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr_01);
                }
                (this->m_constraints).m_data = (btTypedConstraint **)0x0;
              }
              (this->m_constraints).m_ownsMemory = true;
              (this->m_constraints).m_data = ppbVar6;
              (this->m_constraints).m_capacity = iVar9;
            }
          }
          iVar13 = (this->m_constraints).m_size;
          (this->m_constraints).m_data[iVar13] = ppbVar14[uVar11];
          (this->m_constraints).m_size = iVar13 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar8);
      }
      if ((this->m_manifolds).m_size + (this->m_constraints).m_size <=
          (this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
        return;
      }
      processConstraints(this);
      return;
    }
    pp_Var12 = this->m_solver->_vptr_btConstraintSolver;
  }
  (*pp_Var12[3])();
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,&m_sortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			int numCurConstraints = 0;
			int i;

			//find the first constraint for this island
			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{

				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}